

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void kj::ArrayDisposer::
     Dispose_<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
     destruct(void *ptr)

{
  if (*ptr != (long *)((long)ptr + 0x10)) {
    operator_delete(*ptr,*(long *)((long)ptr + 0x10) + 1);
    return;
  }
  return;
}

Assistant:

static void destruct(void* ptr) {
    kj::dtor(*reinterpret_cast<T*>(ptr));
  }